

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_add_read_buf_callback
                  (mz_zip_archive *pZip,char *pArchive_name,mz_file_read_func read_callback,
                  void *callback_opaque,mz_uint64 size_to_add,time_t *pFile_time,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags,char *user_extra_data,
                  mz_uint user_extra_data_len,char *user_extra_data_central,
                  mz_uint user_extra_data_central_len)

{
  mz_zip_internal_state *pmVar1;
  size_t sVar2;
  mz_bool mVar3;
  tdefl_status tVar4;
  mz_uint32 mVar5;
  mz_uint64 *pmVar6;
  size_t sVar7;
  mz_uint64 mVar8;
  size_t sVar9;
  undefined4 extraout_var;
  undefined1 uVar10;
  undefined1 uVar11;
  uint uVar12;
  tdefl_flush flush;
  mz_zip_error mVar13;
  mz_uint64 *pLocal_header_ofs;
  mz_uint64 *pmVar14;
  mz_uint64 *pmVar15;
  mz_uint64 mVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  mz_uint8 *pmVar22;
  mz_uint64 mVar23;
  mz_uint64 mVar24;
  mz_ulong local_120;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint8 *local_110;
  mz_uint64 comp_size;
  mz_uint64 uncomp_size;
  int local_f4;
  undefined8 local_f0;
  size_t local_e8;
  uint local_e0;
  uint local_dc;
  size_t local_d8;
  tdefl_compressor *local_d0;
  mz_zip_writer_add_state state;
  mz_uint64 local_dir_header_ofs;
  undefined1 local_98 [5];
  undefined2 uStack_93;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  long lStack_82;
  mz_file_read_func local_78;
  void *local_70;
  mz_uint8 *local_68;
  ulong local_60;
  mz_uint8 extra_data [28];
  
  dos_time = 0;
  dos_date = 0;
  local_110 = (mz_uint8 *)pZip->m_archive_size;
  comp_size = 0;
  local_120._0_4_ = 6;
  if (-1 < (int)level_and_flags) {
    local_120._0_4_ = level_and_flags;
  }
  pmVar1 = pZip->m_pState;
  if ((((pmVar1 == (mz_zip_internal_state *)0x0) || (pArchive_name == (char *)0x0)) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pComment == (void *)0x0 && comment_size != 0 || 10 < ((uint)local_120 & 0xf))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  iVar20 = pmVar1->m_zip64;
  if (size_to_add >> 0x20 != 0 && iVar20 == 0) {
    pmVar1->m_zip64 = 1;
    iVar20 = 1;
  }
  if (((uint)local_120 >> 10 & 1) != 0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pArchive_name == '/') {
LAB_001614f3:
    pZip->m_last_error = MZ_ZIP_INVALID_FILENAME;
    return 0;
  }
  if (iVar20 == 0) {
    uVar17 = (undefined4)CONCAT71((uint7)(size_to_add >> 0x28),1);
    if (pZip->m_total_files == 0xffff) {
      pmVar1->m_zip64 = 1;
      uVar17 = 0;
    }
  }
  else {
    uVar17 = 0;
    if (pZip->m_total_files == 0xffffffff) {
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  local_f0 = CONCAT44(local_f0._4_4_,uVar17);
  local_120._0_4_ = (uint)local_120 & 0xf;
  uncomp_size = size_to_add;
  local_78 = read_callback;
  local_70 = callback_opaque;
  local_e8 = strlen(pArchive_name);
  if (0xffff < local_e8) goto LAB_001614f3;
  iVar20 = (int)pZip->m_file_offset_alignment;
  uVar12 = iVar20 - 1;
  uVar21 = (ulong)(iVar20 - (uVar12 & (uint)local_110) & uVar12);
  if (pZip->m_file_offset_alignment == 0) {
    uVar21 = 0;
  }
  sVar9 = (pmVar1->m_central_dir).m_size;
  local_60 = (ulong)comment_size;
  if (0xfffffffe < local_e8 + local_60 + sVar9 + 0x4a) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if (((char)local_f0 != '\0') &&
     (uVar21 + (ulong)user_extra_data_central_len + (long)local_110 + user_extra_data_len + local_60
               + local_e8 * 2 + sVar9 + 0x472 >> 0x20 != 0)) {
    pmVar1->m_zip64 = 1;
  }
  local_f0 = uVar21;
  if (pFile_time != (time_t *)0x0) {
    mz_zip_time_t_to_dos_time(*pFile_time,&dos_time,&dos_date);
    size_to_add = uncomp_size;
  }
  pmVar22 = local_110;
  if (size_to_add < 4) {
    local_120._0_4_ = 0;
  }
  mVar3 = mz_zip_writer_write_zeros(pZip,(mz_uint64)local_110,(mz_uint32)uVar21);
  sVar2 = local_e8;
  if (mVar3 == 0) {
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  uVar21 = (long)pmVar22 + local_f0;
  local_dir_header_ofs = uVar21;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar21) != 0)) {
    __assert_fail("(cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/miniz/miniz.c"
                  ,0x1954,
                  "mz_bool mz_zip_writer_add_read_buf_callback(mz_zip_archive *, const char *, mz_file_read_func, void *, mz_uint64, const time_t *, const void *, mz_uint16, mz_uint, const char *, mz_uint, const char *, mz_uint)"
                 );
  }
  iVar19 = (uint)((level_and_flags >> 0x10 & 1) == 0) << 0xb;
  iVar20 = (uint)((uint)local_120 != 0) << 3;
  uStack_88 = 0;
  lStack_82 = 0;
  _local_98 = 0;
  uStack_90 = 0;
  uStack_8f = 0;
  uStack_8e = 0;
  uStack_8d = 0;
  uStack_8c = 0;
  uStack_8b = 0;
  uStack_8a = 0;
  uVar11 = (undefined1)((uint)iVar19 >> 8);
  if (pmVar1->m_zip64 == 0) {
    if ((comp_size._4_4_ != 0) || (uVar21 >> 0x20 != 0)) goto LAB_00161bd2;
    uVar10 = 0x14;
    if ((uint)local_120 == 0) {
      uVar10 = 0;
    }
    local_98 = (undefined1  [5])CONCAT14(uVar10,0x4034b50);
    _local_98 = CONCAT16(8,CONCAT15(0,local_98));
    local_f0 = CONCAT44(local_f0._4_4_,iVar19) | 8;
    _local_98 = CONCAT17(uVar11,_local_98);
    uStack_8e = (undefined1)dos_time;
    local_dc = (uint)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    local_e0 = (uint)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)(user_extra_data_len >> 8),
                                CONCAT12((char)user_extra_data_len,(short)local_e8)) << 0x20;
    uStack_90 = (char)iVar20;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21,local_98,0x1e);
    if (sVar9 != 0x1e) goto LAB_00161a71;
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21 + 0x1e,pArchive_name,sVar2);
    if (sVar9 != sVar2) goto LAB_00161a71;
    mVar23 = uVar21 + 0x1e + sVar2;
    pmVar22 = (mz_uint8 *)0x0;
    sVar9 = 0;
  }
  else {
    if ((size_to_add < 0xffffffff) && (uVar21 < 0xffffffff)) {
      pmVar22 = (mz_uint8 *)0x0;
      sVar9 = 0;
    }
    else {
      pmVar6 = (mz_uint64 *)0x0;
      pmVar14 = &uncomp_size;
      if (size_to_add < 0xffffffff) {
        pmVar14 = pmVar6;
      }
      pmVar15 = &comp_size;
      if (size_to_add < 0xffffffff) {
        pmVar15 = pmVar6;
      }
      pLocal_header_ofs = &local_dir_header_ofs;
      if (uVar21 < 0xffffffff) {
        pLocal_header_ofs = pmVar6;
      }
      pmVar22 = extra_data;
      mVar5 = mz_zip_writer_create_zip64_extra_data(pmVar22,pmVar14,pmVar15,pLocal_header_ofs);
      sVar9 = (size_t)mVar5;
    }
    sVar2 = local_e8;
    iVar18 = (int)sVar9 + user_extra_data_len;
    uVar10 = 0x14;
    if ((uint)local_120 == 0) {
      uVar10 = 0;
    }
    local_98 = (undefined1  [5])CONCAT14(uVar10,0x4034b50);
    _local_98 = CONCAT25(0x800,local_98);
    local_f0 = CONCAT44(local_f0._4_4_,iVar19) | 8;
    _local_98 = CONCAT17(uVar11,_local_98);
    uStack_8f = 0;
    uStack_8e = (undefined1)dos_time;
    local_dc = (uint)dos_time;
    uStack_8d = (undefined1)(dos_time >> 8);
    uStack_8c = (undefined1)dos_date;
    local_e0 = (uint)dos_date;
    uStack_8b = (undefined1)(dos_date >> 8);
    uStack_8a = 0;
    uStack_88 = 0;
    lStack_82 = (ulong)CONCAT13((char)((uint)iVar18 >> 8),CONCAT12((char)iVar18,(short)local_e8)) <<
                0x20;
    uStack_90 = (char)iVar20;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21,local_98,0x1e);
    if (sVar7 != 0x1e) goto LAB_00161a71;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21 + 0x1e,pArchive_name,sVar2);
    if (sVar7 != sVar2) goto LAB_00161a71;
    mVar23 = uVar21 + 0x1e + sVar2;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,extra_data,sVar9);
    if (sVar7 != sVar9) goto LAB_00161a71;
    mVar23 = mVar23 + sVar9;
  }
  if (user_extra_data_len != 0) {
    uVar21 = (ulong)user_extra_data_len;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,user_extra_data,uVar21);
    if (sVar7 != uVar21) {
LAB_00161a71:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    mVar23 = mVar23 + uVar21;
  }
  mVar24 = uncomp_size;
  if (uncomp_size == 0) {
    local_120._0_4_ = 0;
  }
  else {
    local_68 = pmVar22;
    local_110 = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
    if (local_110 == (mz_uint8 *)0x0) {
LAB_00161c02:
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    local_f4 = iVar20;
    local_d8 = sVar9;
    if ((uint)local_120 == 0) {
      local_120 = 0;
      mVar16 = 0;
      do {
        sVar9 = 0x10000;
        if (mVar24 < 0x10000) {
          sVar9 = mVar24;
        }
        sVar7 = (*local_78)(local_70,mVar16,local_110,sVar9);
        if ((sVar7 != sVar9) ||
           (sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,local_110,sVar9), sVar7 != sVar9)) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
          return 0;
        }
        mVar16 = mVar16 + sVar9;
        local_120 = mz_crc32(local_120,local_110,sVar9);
        mVar23 = mVar23 + sVar9;
        mVar24 = mVar24 - sVar9;
        mVar8 = uncomp_size;
      } while (mVar24 != 0);
    }
    else {
      local_d0 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
      if (local_d0 == (tdefl_compressor *)0x0) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
        goto LAB_00161c02;
      }
      state.m_comp_size = 0;
      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = mVar23;
      tdefl_init(local_d0,mz_zip_writer_add_put_buf_callback,&state,
                 (uint)((uint)local_120 < 4) << 0xe |
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[(uint)local_120]
                );
      mVar23 = 0;
      local_120 = 0;
      pmVar22 = local_110;
      do {
        sVar9 = 0x10000;
        if (mVar24 < 0x10000) {
          sVar9 = mVar24;
        }
        sVar7 = (*local_78)(local_70,mVar23,pmVar22,sVar9);
        if (sVar7 != sVar9) {
          mVar13 = MZ_ZIP_FILE_READ_FAILED;
          goto LAB_00161d37;
        }
        local_120 = mz_crc32(local_120,pmVar22,sVar9);
        if (pZip->m_pNeeds_keepalive == (mz_file_needs_keepalive)0x0) {
          flush = TDEFL_NO_FLUSH;
        }
        else {
          mVar3 = (*pZip->m_pNeeds_keepalive)(pZip->m_pIO_opaque);
          flush = (uint)(mVar3 != 0) * 3;
        }
        pmVar22 = local_110;
        mVar23 = mVar23 + sVar9;
        mVar24 = mVar24 - sVar9;
        if (mVar24 == 0) {
          flush = TDEFL_FINISH;
        }
        tVar4 = tdefl_compress_buffer(local_d0,local_110,sVar9,flush);
      } while (tVar4 == TDEFL_STATUS_OKAY);
      mVar13 = MZ_ZIP_COMPRESSION_FAILED;
      if (tVar4 != TDEFL_STATUS_DONE) {
LAB_00161d37:
        pZip->m_last_error = mVar13;
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_d0);
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
        return 0;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_d0);
      mVar8 = state.m_comp_size;
      mVar23 = state.m_cur_archive_file_ofs;
    }
    comp_size = mVar8;
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_110);
    sVar9 = local_d8;
    pmVar22 = local_68;
    iVar20 = local_f4;
  }
  mVar24 = state.m_cur_archive_file_ofs;
  state.m_pZip = (mz_zip_archive *)
                 CONCAT17((char)((uint)local_120 >> 0x18),
                          CONCAT16((char)((uint)local_120 >> 0x10),
                                   CONCAT15((char)((uint)local_120 >> 8),
                                            CONCAT14((char)(uint)local_120,0x8074b50))));
  uVar11 = (undefined1)(uncomp_size >> 0x18);
  if (pmVar22 == (mz_uint8 *)0x0) {
    if (comp_size >> 0x20 != 0) {
LAB_00161bd2:
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    pmVar14 = &state.m_cur_archive_file_ofs;
    state.m_cur_archive_file_ofs._7_1_ = SUB81(mVar24,7);
    state.m_cur_archive_file_ofs._0_7_ =
         CONCAT16((char)(uncomp_size >> 0x10),
                  CONCAT15((char)(uncomp_size >> 8),CONCAT14((char)uncomp_size,(int)comp_size)));
    sVar7 = 0x10;
  }
  else {
    pmVar14 = &state.m_comp_size;
    state.m_cur_archive_file_ofs = comp_size;
    state.m_comp_size._0_7_ = (undefined7)uncomp_size;
    uVar11 = (undefined1)(uncomp_size >> 0x38);
    sVar7 = 0x18;
  }
  *(undefined1 *)((long)pmVar14 + 7) = uVar11;
  local_110 = (mz_uint8 *)mVar23;
  local_f4 = iVar20;
  local_d8 = sVar9;
  sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar23,&state,sVar7);
  if (sVar9 != sVar7) {
    return 0;
  }
  if (pmVar22 != (mz_uint8 *)0x0) {
    pmVar14 = (mz_uint64 *)0x0;
    pmVar6 = &uncomp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar6 = pmVar14;
    }
    pmVar15 = &comp_size;
    if (uncomp_size < 0xffffffff) {
      pmVar15 = pmVar14;
    }
    if (0xfffffffe < local_dir_header_ofs) {
      pmVar14 = &local_dir_header_ofs;
    }
    mVar5 = mz_zip_writer_create_zip64_extra_data(extra_data,pmVar6,pmVar15,pmVar14);
    local_d8 = CONCAT44(extraout_var,mVar5);
  }
  mVar3 = mz_zip_writer_add_to_central_dir
                    (pZip,pArchive_name,(mz_uint16)local_e8,pmVar22,(mz_uint16)local_d8,pComment,
                     (mz_uint16)local_60,uncomp_size,comp_size,(uint)local_120,(mz_uint16)local_f4,
                     (mz_uint16)local_f0,(mz_uint16)local_dc,(mz_uint16)local_e0,
                     local_dir_header_ofs,0,user_extra_data_central,user_extra_data_central_len);
  if (mVar3 != 0) {
    pZip->m_total_files = pZip->m_total_files + 1;
    pZip->m_archive_size = sVar7 + (long)local_110;
    return 1;
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_read_buf_callback(mz_zip_archive *pZip, const char *pArchive_name, mz_file_read_func read_callback, void* callback_opaque, mz_uint64 size_to_add, const MZ_TIME_T *pFile_time, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags,
                                const char *user_extra_data, mz_uint user_extra_data_len, const char *user_extra_data_central, mz_uint user_extra_data_central_len)
{
    mz_uint16 gen_flags = MZ_ZIP_LDH_BIT_FLAG_HAS_LOCATOR;
    mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
    mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
    mz_uint64 local_dir_header_ofs, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = size_to_add, comp_size = 0;
    size_t archive_name_size;
    mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
    mz_uint8 *pExtra_data = NULL;
    mz_uint32 extra_size = 0;
    mz_uint8 extra_data[MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE];
    mz_zip_internal_state *pState;
	mz_uint64 file_ofs = 0;

    if (!(level_and_flags & MZ_ZIP_FLAG_ASCII_FILENAME))
        gen_flags |= MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_UTF8;

    if ((int)level_and_flags < 0)
        level_and_flags = MZ_DEFAULT_LEVEL;
    level = level_and_flags & 0xF;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    if ((!pState->m_zip64) && (uncomp_size > MZ_UINT32_MAX))
    {
        /* Source file is too large for non-zip64 */
        /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        pState->m_zip64 = MZ_TRUE;
    }

    /* We could support this, but why? */
    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_validate_archive_name(pArchive_name))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    if (pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES); */
        }
    }

    archive_name_size = strlen(pArchive_name);
    if (archive_name_size > MZ_UINT16_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_FILENAME);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
    if (((mz_uint64)pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP64_MAX_CENTRAL_EXTRA_FIELD_SIZE + comment_size) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    if (!pState->m_zip64)
    {
        /* Bail early if the archive would obviously become too large */
        if ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + archive_name_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE
			+ archive_name_size + comment_size + user_extra_data_len + pState->m_central_dir.m_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 1024
			+ MZ_ZIP_DATA_DESCRIPTER_SIZE32 + user_extra_data_central_len) > 0xFFFFFFFF)
        {
            pState->m_zip64 = MZ_TRUE;
            /*return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE); */
        }
    }

#ifndef MINIZ_NO_TIME
    if (pFile_time)
    {
        mz_zip_time_t_to_dos_time(*pFile_time, &dos_time, &dos_date);
    }
#endif

    if (uncomp_size <= 3)
        level = 0;

    if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes))
    {
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
    }

    cur_archive_file_ofs += num_alignment_padding_bytes;
    local_dir_header_ofs = cur_archive_file_ofs;

    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((cur_archive_file_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    if (uncomp_size && level)
    {
        method = MZ_DEFLATED;
    }

    MZ_CLEAR_OBJ(local_dir_header);
    if (pState->m_zip64)
    {
        if (uncomp_size >= MZ_UINT32_MAX || local_dir_header_ofs >= MZ_UINT32_MAX)
        {
            pExtra_data = extra_data;
            extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                               (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
        }

        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)(extra_size + user_extra_data_len), 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, extra_data, extra_size) != extra_size)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += extra_size;
    }
    else
    {
        if ((comp_size > MZ_UINT32_MAX) || (cur_archive_file_ofs > MZ_UINT32_MAX))
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
        if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, (mz_uint16)user_extra_data_len, 0, 0, 0, method, gen_flags, dos_time, dos_date))
            return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += sizeof(local_dir_header);

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_archive_file_ofs += archive_name_size;
    }

    if (user_extra_data_len > 0)
    {
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, user_extra_data, user_extra_data_len) != user_extra_data_len)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_archive_file_ofs += user_extra_data_len;
    }

    if (uncomp_size)
    {
        mz_uint64 uncomp_remaining = uncomp_size;
        void *pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
        if (!pRead_buf)
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!level)
        {
            while (uncomp_remaining)
            {
                mz_uint n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
                if ((read_callback(callback_opaque, file_ofs, pRead_buf, n) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n))
                {
                    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                }
				file_ofs += n;
                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, n);
                uncomp_remaining -= n;
                cur_archive_file_ofs += n;
            }
            comp_size = uncomp_size;
        }
        else
        {
            mz_bool result = MZ_FALSE;
            mz_zip_writer_add_state state;
            tdefl_compressor *pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
            if (!pComp)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            state.m_pZip = pZip;
            state.m_cur_archive_file_ofs = cur_archive_file_ofs;
            state.m_comp_size = 0;

            if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);
            }

            for (;;)
            {
                size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
                tdefl_status status;
                tdefl_flush flush = TDEFL_NO_FLUSH;

                if (read_callback(callback_opaque, file_ofs, pRead_buf, in_buf_size)!= in_buf_size)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    break;
                }

				file_ofs += in_buf_size;
                uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8 *)pRead_buf, in_buf_size);
                uncomp_remaining -= in_buf_size;

                if (pZip->m_pNeeds_keepalive != NULL && pZip->m_pNeeds_keepalive(pZip->m_pIO_opaque))
                    flush = TDEFL_FULL_FLUSH;

                status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? flush : TDEFL_FINISH);
                if (status == TDEFL_STATUS_DONE)
                {
                    result = MZ_TRUE;
                    break;
                }
                else if (status != TDEFL_STATUS_OKAY)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_COMPRESSION_FAILED);
                    break;
                }
            }

            pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

            if (!result)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
                return MZ_FALSE;
            }

            comp_size = state.m_comp_size;
            cur_archive_file_ofs = state.m_cur_archive_file_ofs;
        }

        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
    }

    {
        mz_uint8 local_dir_footer[MZ_ZIP_DATA_DESCRIPTER_SIZE64];
        mz_uint32 local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE32;

        MZ_WRITE_LE32(local_dir_footer + 0, MZ_ZIP_DATA_DESCRIPTOR_ID);
        MZ_WRITE_LE32(local_dir_footer + 4, uncomp_crc32);
        if (pExtra_data == NULL)
        {
            if (comp_size > MZ_UINT32_MAX)
                return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

            MZ_WRITE_LE32(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE32(local_dir_footer + 12, uncomp_size);
        }
        else
        {
            MZ_WRITE_LE64(local_dir_footer + 8, comp_size);
            MZ_WRITE_LE64(local_dir_footer + 16, uncomp_size);
            local_dir_footer_size = MZ_ZIP_DATA_DESCRIPTER_SIZE64;
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, local_dir_footer, local_dir_footer_size) != local_dir_footer_size)
            return MZ_FALSE;

        cur_archive_file_ofs += local_dir_footer_size;
    }

    if (pExtra_data != NULL)
    {
        extra_size = mz_zip_writer_create_zip64_extra_data(extra_data, (uncomp_size >= MZ_UINT32_MAX) ? &uncomp_size : NULL,
                                                           (uncomp_size >= MZ_UINT32_MAX) ? &comp_size : NULL, (local_dir_header_ofs >= MZ_UINT32_MAX) ? &local_dir_header_ofs : NULL);
    }

    if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, pExtra_data, (mz_uint16)extra_size, pComment, comment_size,
                                          uncomp_size, comp_size, uncomp_crc32, method, gen_flags, dos_time, dos_date, local_dir_header_ofs, ext_attributes,
                                          user_extra_data_central, user_extra_data_central_len))
        return MZ_FALSE;

    pZip->m_total_files++;
    pZip->m_archive_size = cur_archive_file_ofs;

    return MZ_TRUE;
}